

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O3

void __thiscall Firework::update(Firework *this)

{
  anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
  aVar1;
  bool bVar2;
  pointer pPVar3;
  pointer __src;
  Particle *particle;
  pointer pPVar4;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar5;
  
  if (this->exploded == false) {
    Particle::update(&this->rocket);
    if (0.0 <= (this->rocket).velocity.field_0.field_0.y) {
      explode(this);
      return;
    }
  }
  else {
    pPVar4 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar4 != pPVar3) {
      do {
        aVar1 = (pPVar4->velocity).field_0.field_0;
        aVar5._0_4_ = aVar1.x * (float)0x3f733333;
        aVar5._4_4_ = aVar1.y * (float)0x3f733333;
        (pPVar4->velocity).field_0 = aVar5;
        Particle::update(pPVar4);
        pPVar4 = pPVar4 + 1;
      } while (pPVar4 != pPVar3);
      pPVar4 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pPVar4 != (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar2 = Particle::isDead(pPVar4);
          if (bVar2) {
            __src = pPVar4 + 1;
            pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (__src != pPVar3) {
              memmove(pPVar4,__src,(long)pPVar3 - (long)__src);
              pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            pPVar3 = pPVar3 + -1;
            (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
            super__Vector_impl_data._M_finish = pPVar3;
          }
          else {
            pPVar4 = pPVar4 + 1;
            pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
        } while (pPVar4 != pPVar3);
      }
    }
  }
  return;
}

Assistant:

void Firework::update() {
    if (!exploded) {
        rocket.update();
        if (rocket.velocity.y >= 0.0f) {
            explode();
        }
    } else {
        for (Particle& particle : particles) {
            particle.velocity *= 0.95;
            particle.update();
        }
        std::vector<Particle>::iterator it = particles.begin();
        while(it != particles.end()) {
            if ((*it).isDead()) {
                it = particles.erase(it);
            } else {
                it++;
            }
        }
    }
}